

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O2

bool cppcms::b64url::decode(string *input,string *output)

{
  size_t s;
  uchar *begin;
  uint uVar1;
  vector<char,_std::allocator<char>_> buf;
  allocator_type local_4a;
  value_type_conflict local_49;
  _Vector_base<char,_std::allocator<char>_> local_48;
  
  s = input->_M_string_length;
  uVar1 = decoded_size(s);
  if (0 < (int)uVar1) {
    begin = (uchar *)(input->_M_dataplus)._M_p;
    local_49 = '\0';
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&local_48,(ulong)uVar1,&local_49,&local_4a);
    decode(begin,begin + s,(uchar *)local_48._M_impl.super__Vector_impl_data._M_start);
    std::__cxx11::string::assign
              ((char *)output,(ulong)local_48._M_impl.super__Vector_impl_data._M_start);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_48);
  }
  return -1 < (int)uVar1;
}

Assistant:

bool CPPCMS_API decode(std::string const &input,std::string &output)
{
	int ds = decoded_size(input.size());
	if(ds < 0)
		return false;
	if(ds == 0)
		return true;
	unsigned char const *begin = reinterpret_cast<unsigned char const *>(input.c_str());
	unsigned char const *end = begin + input.size();
	std::vector<char> buf(ds,0);
	unsigned char *outbuf =  reinterpret_cast<unsigned char *>(&buf[0]);
	decode(begin,end,outbuf);
	output.assign(&buf[0],ds);
	return true;
}